

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

size_t zt_cstr_rchr(char *s,ssize_t i,ssize_t j,int c)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  sVar2 = strlen(s);
  if (sVar2 == 0) {
    sVar3 = 0;
    sVar4 = 0;
  }
  else {
    if (i < 0) {
      sVar5 = sVar2 - 1;
      if ((long)(i + sVar2) < (long)sVar2) {
        sVar5 = i + sVar2;
      }
    }
    else {
      sVar5 = sVar2 - 1;
      if (i < (long)sVar2) {
        sVar5 = i;
      }
    }
    if (j < 0) {
      sVar4 = sVar2 - 1;
      if ((long)(j + sVar2) < (long)sVar2) {
        sVar4 = j + sVar2;
      }
    }
    else {
      sVar4 = sVar2 - 1;
      if (j < (long)sVar2) {
        sVar4 = j;
      }
    }
    sVar3 = sVar4;
    if ((long)sVar4 < (long)sVar5) {
      sVar3 = sVar5;
    }
    if ((long)sVar5 < (long)sVar4) {
      sVar4 = sVar5;
    }
  }
  if ((long)sVar4 <= (long)sVar3) {
    do {
      if (s[sVar3] == c) {
        return sVar3;
      }
      bVar1 = (long)sVar4 < (long)sVar3;
      sVar3 = sVar3 - 1;
    } while (bVar1);
  }
  return 0;
}

Assistant:

size_t
zt_cstr_rchr(const char *s, ssize_t i, ssize_t j, int c) {
    zt_assert(s);

    CONVERT(s, i, j);
    for (; j >= i; j--) {
        if (s[j] == c) {
            return j;
        }
    }

    return 0;
}